

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

bool __thiscall flow::BasicBlock::isComplete(BasicBlock *this)

{
  bool bVar1;
  TerminateInstr *pTVar2;
  Instr *pIVar3;
  IRBuiltinHandler *this_00;
  NativeCallback *pNVar4;
  IRBuiltinFunction *this_01;
  CallInstr *local_50;
  HandlerCallInstr *local_40;
  CallInstr *instr_1;
  HandlerCallInstr *instr;
  BasicBlock *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pTVar2 = getTerminator(this);
    if (pTVar2 == (TerminateInstr *)0x0) {
      pIVar3 = back(this);
      if (pIVar3 == (Instr *)0x0) {
        local_40 = (HandlerCallInstr *)0x0;
      }
      else {
        local_40 = (HandlerCallInstr *)
                   __dynamic_cast(pIVar3,&Instr::typeinfo,&HandlerCallInstr::typeinfo,0);
      }
      if (local_40 == (HandlerCallInstr *)0x0) {
        pIVar3 = back(this);
        if (pIVar3 == (Instr *)0x0) {
          local_50 = (CallInstr *)0x0;
        }
        else {
          local_50 = (CallInstr *)__dynamic_cast(pIVar3,&Instr::typeinfo,&CallInstr::typeinfo,0);
        }
        if (local_50 == (CallInstr *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          this_01 = CallInstr::callee(local_50);
          pNVar4 = IRBuiltinFunction::getNative(this_01);
          this_local._7_1_ = NativeCallback::isNeverReturning(pNVar4);
        }
      }
      else {
        this_00 = HandlerCallInstr::callee(local_40);
        pNVar4 = IRBuiltinHandler::getNative(this_00);
        this_local._7_1_ = NativeCallback::isNeverReturning(pNVar4);
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BasicBlock::isComplete() const {
  if (empty())
    return false;

  if (getTerminator())
    return true;

  if (auto instr = dynamic_cast<HandlerCallInstr*>(back()))
    return instr->callee()->getNative().isNeverReturning();

  if (auto instr = dynamic_cast<CallInstr*>(back()))
    return instr->callee()->getNative().isNeverReturning();

  return false;
}